

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O3

void __thiscall FIX::SocketInitiator::doConnect(SocketInitiator *this,SessionID *s,Dictionary *d)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  Session *pSVar4;
  long *plVar5;
  undefined8 *puVar6;
  SocketConnection *this_00;
  mapped_type *ppSVar7;
  ulong *puVar8;
  long *plVar9;
  ulong uVar10;
  undefined8 uVar11;
  Log *pLVar12;
  socket_handle result;
  undefined4 uStack_1fc;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1f0;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long lStack_1c8;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  long lStack_1a8;
  long *local_1a0;
  undefined8 local_198;
  long local_190;
  undefined8 uStack_188;
  long *local_180;
  undefined8 local_178;
  long local_170;
  undefined8 uStack_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  string local_140;
  string local_120;
  string local_100;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  HostDetails host;
  
  pSVar4 = Session::lookupSession(s);
  DateTime::nowUtc();
  local_1f8 = host.address._M_string_length;
  aStack_1f0._M_allocated_capacity = host.address.field_2._M_allocated_capacity;
  _result = &PTR__DateTime_001f59f0;
  bVar2 = TimeRange::isInRange(&pSVar4->m_sessionTime,(UtcTimeStamp *)&result);
  if (!bVar2) {
    return;
  }
  HostDetailsProvider::getHost(&host,&this->m_hostDetailsProvider,s,d);
  _result = (undefined **)&aStack_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"ReconnectInterval","");
  bVar2 = Dictionary::has(d,(string *)&result);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_result != &aStack_1f0) {
    operator_delete(_result,aStack_1f0._M_allocated_capacity + 1);
  }
  if (bVar2) {
    _result = (undefined **)&aStack_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&result,"ReconnectInterval","");
    iVar3 = Dictionary::getInt(d,(string *)&result);
    this->m_reconnectInterval = iVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_result != &aStack_1f0) {
      operator_delete(_result,aStack_1f0._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_a0,"Connecting to ",&host.address);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_1d0 = *puVar8;
    lStack_1c8 = plVar5[3];
    local_1e0 = &local_1d0;
  }
  else {
    local_1d0 = *puVar8;
    local_1e0 = (ulong *)*plVar5;
  }
  local_1d8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  IntTConvertor<int>::convert_abi_cxx11_
            (&local_100,(IntTConvertor<int> *)(ulong)(ushort)host.port,(int)local_1d8);
  uVar10 = 0xf;
  if (local_1e0 != &local_1d0) {
    uVar10 = local_1d0;
  }
  if (uVar10 < local_100._M_string_length + local_1d8) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      uVar11 = local_100.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_100._M_string_length + local_1d8) goto LAB_001babe4;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_1e0);
  }
  else {
LAB_001babe4:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_100._M_dataplus._M_p);
  }
  local_1a0 = &local_190;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_190 = *plVar5;
    uStack_188 = puVar6[3];
  }
  else {
    local_190 = *plVar5;
    local_1a0 = (long *)*puVar6;
  }
  local_198 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_d0 = *plVar9;
    lStack_c8 = plVar5[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *plVar9;
    local_e0 = (long *)*plVar5;
  }
  local_d8 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)host.sourceAddress._M_dataplus._M_p);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_b0 = *plVar9;
    lStack_a8 = plVar5[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar9;
    local_c0 = (long *)*plVar5;
  }
  local_b8 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_1b0 = *puVar8;
    lStack_1a8 = plVar5[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *puVar8;
    local_1c0 = (ulong *)*plVar5;
  }
  local_1b8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  IntTConvertor<int>::convert_abi_cxx11_
            (&local_120,(IntTConvertor<int> *)(ulong)(ushort)host.sourcePort,(int)local_1b8);
  uVar10 = 0xf;
  if (local_1c0 != &local_1b0) {
    uVar10 = local_1b0;
  }
  if (uVar10 < local_120._M_string_length + local_1b8) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      uVar11 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_120._M_string_length + local_1b8) goto LAB_001badd5;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_1c0);
  }
  else {
LAB_001badd5:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_120._M_dataplus._M_p);
  }
  local_180 = &local_170;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_170 = *plVar5;
    uStack_168 = puVar6[3];
  }
  else {
    local_170 = *plVar5;
    local_180 = (long *)*puVar6;
  }
  local_178 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_150 = *puVar8;
    lStack_148 = plVar5[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar8;
    local_160 = (ulong *)*plVar5;
  }
  local_158 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  IntTConvertor<int>::convert_abi_cxx11_
            (&local_140,(IntTConvertor<int> *)(ulong)(uint)this->m_reconnectInterval,(int)local_158)
  ;
  uVar10 = 0xf;
  if (local_160 != &local_150) {
    uVar10 = local_150;
  }
  if (uVar10 < local_140._M_string_length + local_158) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      uVar11 = local_140.field_2._M_allocated_capacity;
    }
    if (local_140._M_string_length + local_158 <= (ulong)uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,(ulong)local_160);
      goto LAB_001baf3a;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_140._M_dataplus._M_p);
LAB_001baf3a:
  _result = (undefined **)&aStack_1f0;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar1) {
    aStack_1f0._M_allocated_capacity = paVar1->_M_allocated_capacity;
    aStack_1f0._8_4_ = *(undefined4 *)(puVar6 + 3);
    aStack_1f0._12_4_ = *(undefined4 *)((long)puVar6 + 0x1c);
  }
  else {
    aStack_1f0._M_allocated_capacity = paVar1->_M_allocated_capacity;
    _result = (undefined **)*puVar6;
  }
  local_1f8 = puVar6[1];
  *puVar6 = paVar1;
  pLVar12 = &(pSVar4->m_state).super_Log;
  puVar6[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  (*pLVar12->_vptr_Log[6])(pLVar12,&result);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_result != &aStack_1f0) {
    operator_delete(_result,aStack_1f0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  iVar3 = SocketConnector::connect
                    (&this->m_connector,(int)&host,(sockaddr *)(ulong)(uint)(int)host.port,
                     (uint)this->m_noDelay);
  result = iVar3;
  Initiator::setPending(&this->super_Initiator,s);
  this_00 = (SocketConnection *)operator_new(0x2100);
  SocketConnection::SocketConnection(this_00,this,s,iVar3,&(this->m_connector).m_monitor);
  ppSVar7 = std::
            map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
            ::operator[](&this->m_pendingConnections,&result);
  *ppSVar7 = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)host.sourceAddress._M_dataplus._M_p != &host.sourceAddress.field_2) {
    operator_delete(host.sourceAddress._M_dataplus._M_p,
                    host.sourceAddress.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)host.address._M_dataplus._M_p != &host.address.field_2) {
    operator_delete(host.address._M_dataplus._M_p,host.address.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SocketInitiator::doConnect(const SessionID &s, const Dictionary &d) {
  try {

    Session *session = Session::lookupSession(s);
    if (!session->isSessionTime(UtcTimeStamp::now())) {
      return;
    }

    Log *log = session->getLog();

    HostDetails host = m_hostDetailsProvider.getHost(s, d);
    if (d.has(RECONNECT_INTERVAL)) // ReconnectInterval in [SESSION]
    {
      m_reconnectInterval = d.getInt(RECONNECT_INTERVAL);
    }

    log->onEvent(
        "Connecting to " + host.address + " on port " + IntConvertor::convert((unsigned short)host.port) + " (Source "
        + host.sourceAddress + ":" + IntConvertor::convert((unsigned short)host.sourcePort)
        + ") ReconnectInterval=" + IntConvertor::convert((int)m_reconnectInterval));
    socket_handle result = m_connector.connect(
        host.address,
        host.port,
        m_noDelay,
        m_sendBufSize,
        m_rcvBufSize,
        host.sourceAddress,
        host.sourcePort);
    setPending(s);

    m_pendingConnections[result] = new SocketConnection(*this, s, result, &m_connector.getMonitor());
  } catch (std::exception &) {}
}